

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexHelper.cpp
# Opt level: O1

Var Js::RegexHelper::StringReplace
              (JavascriptString *match,JavascriptString *input,JavascriptString *replace)

{
  char16 cVar1;
  code *pcVar2;
  charcount_t cVar3;
  charcount_t cVar4;
  charcount_t cVar5;
  char *pcVar6;
  char16 *content;
  char16 *prefix;
  JavascriptString *pJVar7;
  undefined4 *puVar8;
  CharCount CVar9;
  long lVar10;
  uint uVar11;
  CharCount CVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  uint uVar16;
  bool bVar17;
  undefined1 local_280 [8];
  Builder<256U> concatenated;
  
  pcVar6 = JavascriptString::strstr((char *)input,(char *)match);
  CVar9 = (CharCount)pcVar6;
  if (CVar9 == 0xffffffff) {
    return input;
  }
  uVar14 = (ulong)pcVar6 & 0xffffffff;
  content = JavascriptString::GetString(replace);
  cVar3 = JavascriptString::GetLength(replace);
  bVar17 = cVar3 == 0;
  if (!bVar17) {
    cVar3 = JavascriptString::GetLength(replace);
    if (8 < cVar3) goto LAB_00d4ec1c;
    cVar3 = JavascriptString::GetLength(replace);
    lVar10 = 0;
    if (cVar3 != 0) {
      do {
        if (content[lVar10] == L'$') break;
        cVar3 = JavascriptString::GetLength(replace);
        lVar10 = lVar10 + 1;
      } while ((uint)lVar10 < cVar3);
    }
    cVar3 = JavascriptString::GetLength(replace);
    bVar17 = cVar3 <= (uint)lVar10;
  }
  if (bVar17) {
    prefix = JavascriptString::GetString(input);
    cVar3 = JavascriptString::GetLength(match);
    cVar4 = JavascriptString::GetLength(input);
    cVar5 = JavascriptString::GetLength(match);
    cVar4 = cVar4 - (cVar5 + CVar9);
    cVar5 = JavascriptString::GetLength(replace);
    local_280 = (undefined1  [8])
                BufferStringBuilder::WritableString::New
                          (CVar9 + cVar5 + cVar4,
                           (((((match->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                           super_JavascriptLibraryBase).scriptContext.ptr);
    cVar5 = JavascriptString::GetLength(replace);
    BufferStringBuilder::DbgAssertNotFrozen((BufferStringBuilder *)local_280);
    BufferStringBuilder::WritableString::SetContent
              ((WritableString *)local_280,prefix,CVar9,content,cVar5,prefix + uVar14 + cVar3,cVar4)
    ;
    pJVar7 = BufferStringBuilder::ToString((BufferStringBuilder *)local_280);
    return pJVar7;
  }
LAB_00d4ec1c:
  CompoundString::Builder<256U>::Builder
            ((Builder<256U> *)local_280,
             (((((input->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr);
  if (concatenated._520_8_ == 0) {
    CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
              (input,0,CVar9,(Builder<256U> *)local_280,false);
  }
  else {
    CompoundString::Append((CompoundString *)concatenated._520_8_,input,0,CVar9);
  }
  cVar3 = JavascriptString::GetLength(replace);
  if (cVar3 == 0) {
    CVar12 = 0;
    uVar16 = 0;
  }
  else {
    uVar13 = 0;
    CVar12 = 0;
    concatenated._548_4_ = CVar9;
    do {
      uVar11 = (uint)uVar13;
      uVar16 = uVar11;
      if (content[uVar13] == L'$') {
        uVar15 = uVar11 + 1;
        cVar3 = JavascriptString::GetLength(replace);
        if (uVar15 < cVar3) {
          cVar1 = content[uVar15];
          uVar16 = uVar15;
          if ((ushort)cVar1 < 0x27) {
            if (cVar1 == L'$') {
              CVar9 = uVar15 - CVar12;
              pJVar7 = replace;
              if (concatenated._520_8_ == 0) {
LAB_00d4eddb:
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (pJVar7,CVar12,CVar9,(Builder<256U> *)local_280,false);
              }
              else {
LAB_00d4edae:
                CompoundString::Append((CompoundString *)concatenated._520_8_,pJVar7,CVar12,CVar9);
              }
            }
            else {
              if (cVar1 != L'&') goto LAB_00d4ece6;
              if (concatenated._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (replace,CVar12,uVar11 - CVar12,(Builder<256U> *)local_280,false);
              }
              else {
                CompoundString::Append
                          ((CompoundString *)concatenated._520_8_,replace,CVar12,uVar11 - CVar12);
              }
              if (concatenated._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (match,(Builder<256U> *)local_280,false);
              }
              else {
                CompoundString::Append((CompoundString *)concatenated._520_8_,match);
              }
            }
            CVar12 = uVar11 + 2;
          }
          else {
            CVar9 = (CharCount)uVar14;
            if (cVar1 == L'\'') {
              if (concatenated._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (replace,CVar12,uVar11 - CVar12,(Builder<256U> *)local_280,false);
              }
              else {
                CompoundString::Append
                          ((CompoundString *)concatenated._520_8_,replace,CVar12,uVar11 - CVar12);
              }
              cVar3 = JavascriptString::GetLength(match);
              cVar4 = JavascriptString::GetLength(input);
              cVar5 = JavascriptString::GetLength(match);
              CVar12 = cVar4 - (cVar5 + CVar9);
              if (concatenated._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (input,cVar3 + CVar9,CVar12,(Builder<256U> *)local_280,false);
              }
              else {
                CompoundString::Append
                          ((CompoundString *)concatenated._520_8_,input,cVar3 + CVar9,CVar12);
              }
              CVar12 = uVar11 + 2;
              uVar14 = (ulong)(uint)concatenated._548_4_;
            }
            else if (cVar1 == L'`') {
              if (concatenated._520_8_ == 0) {
                CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
                          (replace,CVar12,uVar11 - CVar12,(Builder<256U> *)local_280,false);
              }
              else {
                CompoundString::Append
                          ((CompoundString *)concatenated._520_8_,replace,CVar12,uVar11 - CVar12);
              }
              if (concatenated._520_8_ == 0) {
                CVar12 = 0;
                pJVar7 = input;
                goto LAB_00d4eddb;
              }
              CVar12 = 0;
              pJVar7 = input;
              goto LAB_00d4edae;
            }
          }
        }
      }
LAB_00d4ece6:
      CVar9 = (CharCount)uVar14;
      uVar16 = uVar16 + 1;
      cVar3 = JavascriptString::GetLength(replace);
      uVar13 = (ulong)uVar16;
    } while (uVar16 < cVar3);
  }
  if (uVar16 < CVar12) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar17 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/RegexHelper.cpp"
                                 ,0x5c5,"(i <= j)","i <= j");
    if (!bVar17) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar8 = 0;
  }
  if (concatenated._520_8_ == 0) {
    CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
              (replace,CVar12,uVar16 - CVar12,(Builder<256U> *)local_280,false);
  }
  else {
    CompoundString::Append((CompoundString *)concatenated._520_8_,replace,CVar12,uVar16 - CVar12);
  }
  cVar3 = JavascriptString::GetLength(match);
  cVar4 = JavascriptString::GetLength(input);
  cVar5 = JavascriptString::GetLength(match);
  CVar12 = cVar4 - (cVar5 + CVar9);
  if (concatenated._520_8_ == 0) {
    CompoundString::AppendGeneric<Js::CompoundString::Builder<256u>>
              (input,cVar3 + CVar9,CVar12,(Builder<256U> *)local_280,false);
  }
  else {
    CompoundString::Append((CompoundString *)concatenated._520_8_,input,cVar3 + CVar9,CVar12);
  }
  pJVar7 = CompoundString::Builder<256U>::ToString((Builder<256U> *)local_280);
  return pJVar7;
}

Assistant:

Var RegexHelper::StringReplace(JavascriptString* match, JavascriptString* input, JavascriptString* replace)
    {
        CharCount matchedIndex = JavascriptString::strstr(input, match, true);
        if (matchedIndex == CharCountFlag)
        {
            return input;
        }

        const char16 *const replaceStr = replace->GetString();

        // Unfortunately, due to the possibility of there being $ escapes, we can't just wmemcpy the replace string. Check if we
        // have a small replace string that we can quickly scan for '$', to see if we can just wmemcpy.
        bool definitelyNoEscapes = replace->GetLength() == 0;
        if(!definitelyNoEscapes && replace->GetLength() <= 8)
        {
            CharCount i = 0;
            for(; i < replace->GetLength() && replaceStr[i] != _u('$'); ++i);
            definitelyNoEscapes = i >= replace->GetLength();
        }

        if(definitelyNoEscapes)
        {
            const char16* inputStr = input->GetString();
            const char16* prefixStr = inputStr;
            CharCount prefixLength = (CharCount)matchedIndex;
            const char16* postfixStr = inputStr + prefixLength + match->GetLength();
            CharCount postfixLength = input->GetLength() - prefixLength - match->GetLength();
            CharCount newLength = prefixLength + postfixLength + replace->GetLength();
            BufferStringBuilder bufferString(newLength, match->GetScriptContext());
            bufferString.SetContent(prefixStr, prefixLength,
                                    replaceStr, replace->GetLength(),
                                    postfixStr, postfixLength);
            return bufferString.ToString();
        }

        CompoundString::Builder<64 * sizeof(void *) / sizeof(char16)> concatenated(input->GetScriptContext());

        // Copy portion of input string that precedes the matched substring
        concatenated.Append(input, 0, matchedIndex);

        // Copy the replace string with substitutions
        CharCount i = 0, j = 0;
        for(; j < replace->GetLength(); ++j)
        {
            if(replaceStr[j] == _u('$') && j + 1 < replace->GetLength())
            {
                switch(replaceStr[j + 1])
                {
                    case _u('$'): // literal '$'
                        ++j;
                        concatenated.Append(replace, i, j - i);
                        i = j + 1;
                        break;

                    case _u('&'): // matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(match);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('`'): // portion of input string that precedes the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(input, 0, matchedIndex);
                        ++j;
                        i = j + 1;
                        break;

                    case _u('\''): // portion of input string that follows the matched substring
                        concatenated.Append(replace, i, j - i);
                        concatenated.Append(
                            input,
                            matchedIndex + match->GetLength(),
                            input->GetLength() - matchedIndex - match->GetLength());
                        ++j;
                        i = j + 1;
                        break;

                    default: // take both the initial '$' and the following character literally
                        ++j;
                }
            }
        }
        Assert(i <= j);
        concatenated.Append(replace, i, j - i);

        // Copy portion of input string that follows the matched substring
        concatenated.Append(input, matchedIndex + match->GetLength(), input->GetLength() - matchedIndex - match->GetLength());

        return concatenated.ToString();
    }